

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  size_t i;
  ulong uVar2;
  char buf [128];
  allocator local_d9;
  string local_d8 [32];
  char local_b8 [136];
  
  std::operator<<(ofs,"[");
  for (uVar2 = 0;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      std::operator<<(ofs,", ");
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    dtoa_milo(pdVar1[uVar2],local_b8);
    std::__cxx11::string::string(local_d8,local_b8,&local_d9);
    std::operator<<(ofs,local_d8);
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<double> &v) {
  // Not sure what is the HARD-LIMT buffer length for dtoa_milo,
  // but according to std::numeric_limits<double>::digits10(=15),
  // 32 should be sufficient, but allocate 128 just in case
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    dtoa_milo(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}